

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O1

bool __thiscall cfd::core::ByteData256::IsEmpty(ByteData256 *this)

{
  pointer __s1;
  pointer puVar1;
  int iVar2;
  undefined8 *__s2;
  value_type_conflict *__val;
  bool bVar3;
  
  __s2 = (undefined8 *)operator_new(0x20);
  *__s2 = 0;
  __s2[1] = 0;
  __s2[2] = 0;
  __s2[3] = 0;
  __s1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)puVar1 - (long)__s1 == 0x20) {
    if (puVar1 == __s1) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp(__s1,__s2,0x20);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  operator_delete(__s2);
  return bVar3;
}

Assistant:

bool ByteData256::IsEmpty() const {
  std::vector<uint8_t> data(kByteData256Length);
  memset(data.data(), 0, data.size());
  return data_ == data;
}